

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processQueryCommand(CommonCore *this,ActionMessage *cmd)

{
  string_view queryStr;
  string_view queryStr_00;
  string_view federateName;
  string_view queryStr_01;
  bool bVar1;
  __type _Var2;
  bool bVar3;
  action_t aVar4;
  GlobalFederateId GVar5;
  route_id rVar6;
  mapped_type *pmVar7;
  string *__str;
  ActionMessage *in_RSI;
  CommonCore *in_RDI;
  __sv_type _Var8;
  string_view sVar9;
  FederateState *fedptr;
  string *target_1;
  ActionMessage queryResp_2;
  string repStr_1;
  string *target;
  ActionMessage queryResp_1;
  ActionMessage queryResp;
  string repStr;
  undefined1 in_stack_0000046f;
  bool force_ordered;
  CommonCore *in_stack_00000470;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  FederateState *in_stack_fffffffffffffb80;
  value_type *in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  CommonCore *in_stack_fffffffffffffb98;
  ActionMessage *in_stack_fffffffffffffba0;
  SmallBuffer *in_stack_fffffffffffffba8;
  ActionMessage *in_stack_fffffffffffffbb8;
  CommonCore *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  string *this_00;
  undefined8 in_stack_fffffffffffffbd8;
  int index;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbe0;
  undefined1 local_390 [24];
  undefined8 in_stack_fffffffffffffc88;
  __uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> this_01;
  undefined1 in_stack_fffffffffffffc90 [16];
  ActionMessage *message;
  CommonCore *in_stack_fffffffffffffca0;
  GlobalFederateId local_324;
  __node_base local_320;
  undefined1 local_318 [4];
  int32_t local_314;
  float local_310;
  GlobalFederateId local_308 [2];
  uint16_t local_300;
  undefined4 local_240;
  BaseType local_23c;
  GlobalFederateId local_238;
  undefined4 local_234;
  BaseType local_230;
  GlobalFederateId local_22c;
  undefined4 local_228;
  GlobalFederateId local_224;
  string *local_220;
  _Prime_rehash_policy local_218;
  undefined1 local_208 [20];
  GlobalFederateId local_1f4 [50];
  undefined4 in_stack_fffffffffffffed4;
  undefined1 force_ordering;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  
  force_ordering = (undefined1)((uint)in_stack_fffffffffffffed4 >> 0x18);
  index = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  bVar3 = false;
  aVar4 = ActionMessage::action(in_RSI);
  message = in_stack_fffffffffffffc90._8_8_;
  this_01._M_t.
  super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>.
  super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl =
       in_stack_fffffffffffffc90._0_8_;
  if (aVar4 == cmd_query_reply) {
LAB_0054d234:
    bVar3 = GlobalFederateId::operator==
                      (&in_RSI->dest_id,
                       (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    GVar5.gid = (BaseType)in_stack_fffffffffffffba0;
    if ((!bVar3) &&
       (bVar3 = GlobalFederateId::operator==(&in_RSI->dest_id,(GlobalFederateId)0xfffc6902), !bVar3)
       ) {
      rVar6 = getRoute(in_stack_fffffffffffffb98,GVar5);
      (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,(ulong)(uint)rVar6.rid,in_RSI);
      return;
    }
    processQueryResponse(in_stack_fffffffffffffca0,message);
    return;
  }
  if (aVar4 != cmd_query) {
    if (aVar4 == cmd_broker_query) {
LAB_0054c5e7:
      bVar3 = GlobalFederateId::operator==
                        (&in_RSI->dest_id,
                         (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      if ((!bVar3) &&
         (bVar3 = GlobalFederateId::operator==(&in_RSI->dest_id,(GlobalFederateId)0xfffc6902),
         !bVar3)) {
        routeMessage((CommonCore *)
                     this_01._M_t.
                     super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                     .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                     (ActionMessage *)in_stack_fffffffffffffc88);
        return;
      }
      SmallBuffer::to_string((SmallBuffer *)0x54c654);
      queryStr._M_str = (char *)this;
      queryStr._M_len = (size_t)cmd;
      coreQuery_abi_cxx11_(in_stack_00000470,queryStr,(bool)in_stack_0000046f);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb80,
                              (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78))
      ;
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        bVar3 = GlobalFederateId::operator==(&in_RSI->source_id,(GlobalFederateId)0xfffc6902);
        if (bVar3) {
          bVar3 = std::
                  deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                  ::empty((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                           *)0x54c8c1);
          if (bVar3) {
            BrokerBase::setTickForwarding(&in_RDI->super_BrokerBase,QUERY_TIMEOUT,true);
          }
          local_1f4._188_8_ = std::chrono::_V2::steady_clock::now();
          std::
          deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
          ::
          emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                     &in_stack_fffffffffffffb88->messageAction,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffb80);
        }
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffffba0,(action_t)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        local_1f4[5].gid = (in_RSI->source_id).gid;
        local_208._16_4_ = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(local_1f4,(GlobalBrokerId)local_208._16_4_);
        local_1f4[3].gid = local_1f4[0].gid;
        local_1f4[2].gid = in_RSI->messageID;
        local_1f4[7].gid._0_2_ = in_RSI->counter;
        local_208._0_16_ = (undefined1  [16])SmallBuffer::to_string((SmallBuffer *)0x54c9f3);
        pmVar7 = std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                 ::at((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                       *)in_stack_fffffffffffffba0,(key_type *)in_stack_fffffffffffffb98);
        std::
        vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
        ::operator[](&in_RDI->mapBuilders,(ulong)pmVar7->first);
        std::
        get<1ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                  ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                    *)0x54ca5c);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                   in_stack_fffffffffffffb88);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffb80);
      }
      else {
        bVar3 = GlobalFederateId::operator==(&in_RSI->source_id,(GlobalFederateId)0xfffc6902);
        if (bVar3) {
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(in_stack_fffffffffffffbe0,index,in_stack_fffffffffffffbd0);
        }
        else {
          ActionMessage::ActionMessage
                    (in_stack_fffffffffffffba0,(action_t)((ulong)in_stack_fffffffffffffb98 >> 0x20))
          ;
          GlobalFederateId::GlobalFederateId
                    ((GlobalFederateId *)&stack0xfffffffffffffee4,
                     (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
          SmallBuffer::operator=
                    (in_stack_fffffffffffffba8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffba0);
          rVar6 = getRoute(in_stack_fffffffffffffb98,
                           (GlobalFederateId)(BaseType)in_stack_fffffffffffffba0);
          (*(in_RDI->super_Core)._vptr_Core[0x6b])
                    (in_RDI,(ulong)(uint)rVar6.rid,&stack0xfffffffffffffee8);
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffb80);
        }
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb80);
      return;
    }
    if (aVar4 != cmd_query_ordered) {
      if (aVar4 != cmd_broker_query_ordered) {
        if (aVar4 != cmd_query_reply_ordered) {
          return;
        }
        goto LAB_0054d234;
      }
      goto LAB_0054c5e7;
    }
    bVar3 = true;
  }
  local_218._M_next_resize._4_4_ = 0;
  bVar1 = GlobalFederateId::operator==(&in_RSI->dest_id,(GlobalBrokerId)0x0);
  if (bVar1) {
    local_218._M_next_resize._0_4_ = 0xfffc6902;
    bVar1 = GlobalFederateId::operator==(&in_RSI->source_id,(GlobalFederateId)0xfffc6902);
    if (bVar1) {
      bVar1 = std::
              deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
              ::empty((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                       *)0x54cb50);
      if (bVar1) {
        BrokerBase::setTickForwarding(&in_RDI->super_BrokerBase,QUERY_TIMEOUT,true);
      }
      local_218._0_8_ = std::chrono::_V2::steady_clock::now();
      std::
      deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
      ::
      emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                 &in_stack_fffffffffffffb88->messageAction,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffb80);
    }
    local_220 = ActionMessage::getString_abi_cxx11_
                          (in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20)
                          );
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb80,
                            (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb80,
                                (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78
                                                )), bVar1)) {
      aVar4 = cmd_broker_query;
      if (bVar3) {
        aVar4 = cmd_broker_query_ordered;
      }
      ActionMessage::setAction(in_RSI,aVar4);
      local_228 = 1;
      GlobalFederateId::GlobalFederateId(&local_224,(GlobalBrokerId)0x1);
      (in_RSI->dest_id).gid = local_224.gid;
      ActionMessage::clearStringData((ActionMessage *)0x54cc66);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb80,
                              (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78))
      ;
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffb80,
                                  (char *)CONCAT44(in_stack_fffffffffffffb7c,
                                                   in_stack_fffffffffffffb78)), bVar1)) {
        aVar4 = cmd_broker_query;
        if (bVar3) {
          aVar4 = cmd_broker_query_ordered;
        }
        ActionMessage::setAction(in_RSI,aVar4);
        local_230 = (in_RDI->super_BrokerBase).higher_broker_id.gid;
        GlobalFederateId::GlobalFederateId(&local_22c,(GlobalBrokerId)local_230);
        (in_RSI->dest_id).gid = local_22c.gid;
        ActionMessage::clearStringData((ActionMessage *)0x54cd06);
      }
    }
    local_234 = 0;
    bVar3 = GlobalBrokerId::operator!=
                      (&(in_RDI->super_BrokerBase).global_broker_id_local,(GlobalBrokerId)0x0);
    if (!bVar3) {
      (in_RSI->source_id).gid = -0x396fe;
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
                ((SimpleQueue<helics::ActionMessage,_std::mutex> *)in_stack_fffffffffffffbc0,
                 in_stack_fffffffffffffbb8);
      return;
    }
    local_23c = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_238,(GlobalBrokerId)local_23c);
    (in_RSI->source_id).gid = local_238.gid;
    local_240 = 0;
    (*(in_RDI->super_Core)._vptr_Core[0x6c])(in_RDI,0,in_RSI);
    return;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffba0,(action_t)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  local_308[0].gid = (in_RSI->source_id).gid;
  local_310 = (float)(in_RSI->dest_id).gid;
  local_314 = in_RSI->messageID;
  local_300 = in_RSI->counter;
  __str = ActionMessage::getString_abi_cxx11_
                    (in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  this_00 = __str;
  local_320._M_nxt = (_Hash_node_base *)__str;
  getIdentifier_abi_cxx11_(in_RDI);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffba0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb98);
  if (_Var2) {
    GlobalFederateId::GlobalFederateId
              (&local_324,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    local_310 = (float)local_324.gid;
    SmallBuffer::to_string((SmallBuffer *)0x54cee4);
    queryStr_00._M_str = (char *)this;
    queryStr_00._M_len = (size_t)cmd;
    coreQuery_abi_cxx11_(in_stack_00000470,queryStr_00,(bool)in_stack_0000046f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb80);
    sVar9._M_str = (char *)in_stack_fffffffffffffba0;
    sVar9._M_len = (size_t)in_stack_fffffffffffffba8;
  }
  else {
    _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb80);
    message = (ActionMessage *)_Var8._M_str;
    federateName._M_str = (char *)this_00;
    federateName._M_len = (size_t)__str;
    in_stack_fffffffffffffb98 =
         (CommonCore *)getFederateCore(in_stack_fffffffffffffbc0,federateName);
    in_stack_fffffffffffffca0 = in_stack_fffffffffffffb98;
    sVar9 = SmallBuffer::to_string((SmallBuffer *)0x54d010);
    queryStr_01._M_len._4_4_ = in_stack_fffffffffffffeec;
    queryStr_01._M_len._0_4_ = in_stack_fffffffffffffee8;
    queryStr_01._M_str._0_4_ = in_stack_fffffffffffffef0;
    queryStr_01._M_str._4_4_ = in_stack_fffffffffffffef4;
    federateQuery_abi_cxx11_
              ((CommonCore *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (FederateState *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               queryStr_01,(bool)force_ordering);
    in_stack_fffffffffffffb80 = (FederateState *)local_390;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb80);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb80,
                            (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if (bVar3) {
      if (in_stack_fffffffffffffca0 != (CommonCore *)0x0) {
        GVar5 = std::atomic::operator_cast_to_GlobalFederateId
                          ((atomic<helics::GlobalFederateId> *)
                           CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        (in_RSI->dest_id).gid = GVar5.gid;
        FederateState::addAction
                  (in_stack_fffffffffffffb80,
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        goto LAB_0054d1ef;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffb80,
                (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
  }
  SmallBuffer::operator=
            ((SmallBuffer *)sVar9._M_len,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar9._M_str);
  bVar3 = GlobalFederateId::operator==(local_308,(GlobalFederateId)0xfffc6902);
  if (bVar3) {
    processQueryResponse(in_stack_fffffffffffffca0,message);
  }
  else {
    rVar6 = getRoute(in_stack_fffffffffffffb98,(GlobalFederateId)(BaseType)sVar9._M_str);
    (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,(ulong)(uint)rVar6.rid,local_318);
  }
LAB_0054d1ef:
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffb80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb80);
  return;
}

Assistant:

void CommonCore::processQueryCommand(ActionMessage& cmd)
{
    bool force_ordered{false};
    switch (cmd.action()) {
        case CMD_BROKER_QUERY_ORDERED:
            force_ordered = true;
            [[fallthrough]];
        case CMD_BROKER_QUERY:

            if (cmd.dest_id == global_broker_id_local || cmd.dest_id == gDirectCoreId) {
                std::string repStr = coreQuery(cmd.payload.to_string(), force_ordered);
                if (repStr != "#wait") {
                    if (cmd.source_id == gDirectCoreId) {
                        activeQueries.setDelayedValue(cmd.messageID, std::move(repStr));
                    } else {
                        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED :
                                                                CMD_QUERY_REPLY);
                        queryResp.dest_id = cmd.source_id;
                        queryResp.source_id = global_broker_id_local;
                        queryResp.messageID = cmd.messageID;
                        queryResp.payload = std::move(repStr);
                        queryResp.counter = cmd.counter;
                        transmit(getRoute(queryResp.dest_id), queryResp);
                    }
                } else {
                    if (cmd.source_id == gDirectCoreId) {
                        if (queryTimeouts.empty()) {
                            setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                        }
                        queryTimeouts.emplace_back(cmd.messageID, std::chrono::steady_clock::now());
                    }
                    ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED :
                                                            CMD_QUERY_REPLY);
                    queryResp.dest_id = cmd.source_id;
                    queryResp.source_id = global_broker_id_local;
                    queryResp.messageID = cmd.messageID;
                    queryResp.counter = cmd.counter;
                    std::get<1>(mapBuilders[mapIndex.at(cmd.payload.to_string()).first])
                        .push_back(queryResp);
                }

            } else {
                routeMessage(std::move(cmd));
            }
            break;
        case CMD_QUERY_ORDERED:
            force_ordered = true;
            [[fallthrough]];
        case CMD_QUERY:
            if (cmd.dest_id == parent_broker_id) {
                if (cmd.source_id == gDirectCoreId) {
                    if (queryTimeouts.empty()) {
                        setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                    }
                    queryTimeouts.emplace_back(cmd.messageID, std::chrono::steady_clock::now());
                }
                const auto& target = cmd.getString(targetStringLoc);
                if (target == "root" || target == "federation") {
                    cmd.setAction(force_ordered ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
                    cmd.dest_id = gRootBrokerID;
                    cmd.clearStringData();
                } else if (target == "parent" || target == "broker") {
                    cmd.setAction(force_ordered ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
                    cmd.dest_id = higher_broker_id;
                    cmd.clearStringData();
                }
                if (global_broker_id_local != parent_broker_id) {
                    // forward on to Broker
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, std::move(cmd));
                } else {
                    // this will get processed when this core is assigned a global hid
                    cmd.source_id = gDirectCoreId;
                    delayTransmitQueue.push(std::move(cmd));
                }
            } else {
                std::string repStr;
                ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
                queryResp.dest_id = cmd.source_id;
                queryResp.source_id = cmd.dest_id;
                queryResp.messageID = cmd.messageID;
                queryResp.counter = cmd.counter;
                const std::string& target = cmd.getString(targetStringLoc);
                if (target == getIdentifier()) {
                    queryResp.source_id = global_broker_id_local;
                    repStr = coreQuery(cmd.payload.to_string(), force_ordered);
                } else {
                    auto* fedptr = getFederateCore(target);
                    repStr = federateQuery(fedptr, cmd.payload.to_string(), force_ordered);
                    if (repStr == "#wait") {
                        if (fedptr != nullptr) {
                            cmd.dest_id = fedptr->global_id;
                            fedptr->addAction(std::move(cmd));
                            break;
                        }
                        repStr = "#error";
                    }
                }

                queryResp.payload = std::move(repStr);
                if (queryResp.dest_id == gDirectCoreId) {
                    processQueryResponse(queryResp);
                } else {
                    transmit(getRoute(queryResp.dest_id), queryResp);
                }
            }
            break;
        case CMD_QUERY_REPLY:
        case CMD_QUERY_REPLY_ORDERED:
            if (cmd.dest_id == global_broker_id_local || cmd.dest_id == gDirectCoreId) {
                processQueryResponse(cmd);
            } else {
                transmit(getRoute(cmd.dest_id), cmd);
            }
            break;
        default:
            break;
    }
}